

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O3

void __thiscall CppGenerator::createGroupVariableOrder(CppGenerator *this)

{
  vector<unsigned_long,std::allocator<unsigned_long>> *pvVar1;
  pointer *this_00;
  pointer pbVar2;
  pointer pvVar3;
  pointer pvVar4;
  TreeDecomposition *pTVar5;
  Aggregate *pAVar6;
  pointer ppVar7;
  iterator iVar8;
  pointer pbVar9;
  pointer puVar10;
  _Bit_type *p_Var11;
  undefined1 auVar12 [16];
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  CppGenerator *pCVar16;
  bool bVar17;
  ulong uVar18;
  ulong *puVar19;
  long lVar20;
  size_t sVar21;
  View *pVVar22;
  TDNode *pTVar23;
  TDNode *pTVar24;
  pointer ppAVar25;
  size_t sVar26;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar27;
  bool *__s;
  size_t *psVar28;
  pointer ppAVar29;
  pointer puVar30;
  ulong uVar31;
  long lVar32;
  size_t var;
  ulong uVar33;
  long lVar34;
  var_bitset intersection;
  unsigned_long local_f8;
  allocator_type local_e9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> **local_e8;
  CppGenerator *local_e0;
  undefined1 local_d8 [16];
  ulong local_c0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> **local_b8;
  long local_b0;
  ulong local_a8 [3];
  size_t *local_90;
  size_t *local_88;
  long local_80;
  View *local_78;
  ulong local_70;
  long local_68;
  ulong local_60;
  vector<bool,_std::allocator<bool>_> local_58;
  
  computeViewOrdering(this);
  pvVar3 = (this->viewGroups).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar4 = (this->viewGroups).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar33 = ((long)pvVar4 - (long)pvVar3 >> 3) * -0x5555555555555555;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar33;
  uVar18 = SUB168(auVar12 * ZEXT816(0x18),0);
  uVar31 = uVar18 + 8;
  if (0xfffffffffffffff7 < uVar18) {
    uVar31 = 0xffffffffffffffff;
  }
  if (SUB168(auVar12 * ZEXT816(0x18),8) != 0) {
    uVar31 = 0xffffffffffffffff;
  }
  puVar19 = (ulong *)operator_new__(uVar31);
  pvVar27 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(puVar19 + 1);
  *puVar19 = uVar33;
  lVar34 = (long)pvVar4 - (long)pvVar3;
  if (lVar34 == 0) {
    local_e8 = &this->groupVariableOrder;
    this->groupVariableOrder = pvVar27;
    puVar19 = (ulong *)operator_new__(uVar31);
    *puVar19 = uVar33;
    local_b8 = &this->groupIncomingViews;
    this->groupIncomingViews =
         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(puVar19 + 1);
    puVar19 = (ulong *)operator_new__(uVar31);
    *puVar19 = uVar33;
    pvVar27 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(puVar19 + 1);
  }
  else {
    lVar20 = 0;
    do {
      *(undefined1 (*) [16])
       ((long)&(pvVar27->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start + lVar20) = (undefined1  [16])0x0;
      *(undefined8 *)((long)puVar19 + lVar20 + 0x18) = 0;
      lVar20 = lVar20 + 0x18;
    } while (lVar34 != lVar20);
    local_e8 = &this->groupVariableOrder;
    this->groupVariableOrder = pvVar27;
    puVar19 = (ulong *)operator_new__(uVar31);
    *puVar19 = uVar33;
    lVar20 = 0;
    do {
      *(undefined1 (*) [16])
       ((long)&(((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(puVar19 + 1))->
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start + lVar20) = (undefined1  [16])0x0;
      *(undefined8 *)((long)puVar19 + lVar20 + 0x18) = 0;
      lVar20 = lVar20 + 0x18;
    } while (lVar34 != lVar20);
    local_b8 = &this->groupIncomingViews;
    this->groupIncomingViews =
         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(puVar19 + 1);
    puVar19 = (ulong *)operator_new__(uVar31);
    *puVar19 = uVar33;
    pvVar27 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(puVar19 + 1);
    memset(pvVar27,0,((lVar34 - 0x18U) / 0x18) * 0x18 + 0x18);
  }
  this->groupViewsPerVarInfo = pvVar27;
  std::vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>::resize
            (&this->groupVariableOrderBitset,uVar33);
  local_e0 = this;
  if ((this->viewGroups).
      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->viewGroups).
      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar18 = 0;
    do {
      local_a8[0] = 0;
      local_a8[1] = 0;
      sVar21 = QueryCompiler::numberOfViews
                         ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr);
      local_f8 = local_f8 & 0xffffffffffffff00;
      std::vector<bool,_std::allocator<bool>_>::vector(&local_58,sVar21,(bool *)&local_f8,&local_e9)
      ;
      pTVar5 = (this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      lVar34 = uVar18 * 3;
      local_c0 = uVar18;
      pVVar22 = QueryCompiler::getView
                          ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,*(this->viewGroups).
                                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar18].
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
      pTVar23 = TreeDecomposition::getRelation(pTVar5,(ulong)pVVar22->_origin);
      pTVar5 = (this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      pVVar22 = QueryCompiler::getView
                          ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,*(this->viewGroups).
                                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar18].
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
      pTVar24 = TreeDecomposition::getRelation(pTVar5,(ulong)pVVar22->_destination);
      local_d8 = (undefined1  [16])0x0;
      if (pTVar23->_id != pTVar24->_id) {
        local_a8[0] = (pTVar23->_bag).super__Base_bitset<2UL>._M_w[0] &
                      (pTVar24->_bag).super__Base_bitset<2UL>._M_w[0];
        local_a8[1] = (pTVar23->_bag).super__Base_bitset<2UL>._M_w[1] &
                      (pTVar24->_bag).super__Base_bitset<2UL>._M_w[1];
        local_d8._8_8_ = local_a8[1];
        local_d8._0_8_ = local_a8[0];
      }
      pvVar3 = (local_e0->viewGroups).
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar28 = pvVar3[uVar18].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start;
      local_90 = *(pointer *)
                  ((long)&pvVar3[uVar18].
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data + 8);
      local_80 = lVar34;
      if (psVar28 != local_90) {
        do {
          pCVar16 = local_e0;
          local_88 = psVar28;
          pVVar22 = QueryCompiler::getView
                              ((local_e0->_qc).
                               super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                               *psVar28);
          pTVar24 = TreeDecomposition::getRelation
                              ((pCVar16->_td).
                               super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr,(ulong)pVVar22->_destination);
          local_b0 = pTVar23->_numOfNeighbors - (ulong)(pVVar22->_origin != pVVar22->_destination);
          if (local_b0 == 0) {
            local_d8._8_8_ =
                 local_d8._8_8_ |
                 (pTVar24->_bag).super__Base_bitset<2UL>._M_w[1] &
                 (pVVar22->_fVars).super__Base_bitset<2UL>._M_w[1];
            local_d8._0_8_ =
                 local_d8._0_8_ |
                 (pTVar24->_bag).super__Base_bitset<2UL>._M_w[0] &
                 (pVVar22->_fVars).super__Base_bitset<2UL>._M_w[0];
          }
          else {
            ppAVar25 = (pVVar22->_aggregates).
                       super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                       super__Vector_impl_data._M_start;
            ppAVar29 = (pVVar22->_aggregates).
                       super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            if (ppAVar29 != ppAVar25) {
              local_68 = local_b0 * 0x10;
              uVar18 = 0;
              local_78 = pVVar22;
              do {
                pAVar6 = ppAVar25[uVar18];
                if ((pAVar6->_agg).
                    super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish !=
                    (pAVar6->_agg).
                    super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
                    _M_impl.super__Vector_impl_data._M_start) {
                  lVar32 = 0;
                  lVar34 = local_b0;
                  local_70 = uVar18;
                  uVar18 = 0;
                  lVar20 = lVar32;
                  do {
                    do {
                      local_60 = uVar18;
                      ppVar7 = (pAVar6->_incoming).
                               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                      pVVar22 = QueryCompiler::getView
                                          ((local_e0->_qc).
                                           super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr,*(size_t *)((long)&ppVar7->first + lVar32));
                      uVar18 = *(ulong *)((long)&ppVar7->first + lVar32);
                      uVar31 = uVar18 + 0x3f;
                      if (-1 < (long)uVar18) {
                        uVar31 = uVar18;
                      }
                      uVar33 = (pVVar22->_fVars).super__Base_bitset<2UL>._M_w[0];
                      uVar13 = (pVVar22->_fVars).super__Base_bitset<2UL>._M_w[1];
                      uVar14 = (pTVar23->_bag).super__Base_bitset<2UL>._M_w[0];
                      uVar15 = (pTVar23->_bag).super__Base_bitset<2UL>._M_w[1];
                      local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                      [((long)uVar31 >> 6) +
                       ((ulong)((uVar18 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
                           local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                           [((long)uVar31 >> 6) +
                            ((ulong)((uVar18 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
                           1L << ((byte)uVar18 & 0x3f);
                      local_d8._8_8_ = local_d8._8_8_ | uVar15 & uVar13;
                      local_d8._0_8_ = local_d8._0_8_ | uVar14 & uVar33;
                      lVar32 = lVar32 + 0x10;
                      lVar34 = lVar34 + -1;
                      uVar18 = local_60;
                    } while (lVar34 != 0);
                    lVar32 = lVar20 + local_68;
                    lVar34 = local_b0;
                    uVar18 = local_60 + 1;
                    lVar20 = lVar32;
                  } while (local_60 + 1 <
                           (ulong)(((long)(pAVar6->_agg).
                                          super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(pAVar6->_agg).
                                          super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 6) *
                                  -0x5555555555555555));
                  ppAVar25 = (local_78->_aggregates).
                             super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                             super__Vector_impl_data._M_start;
                  ppAVar29 = (local_78->_aggregates).
                             super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                             super__Vector_impl_data._M_finish;
                  uVar18 = local_70;
                  lVar34 = local_80;
                }
                uVar18 = uVar18 + 1;
              } while (uVar18 < (ulong)((long)ppAVar29 - (long)ppAVar25 >> 3));
            }
          }
          psVar28 = local_88 + 1;
        } while (psVar28 != local_90);
        local_a8[1] = CONCAT44(local_d8._4_4_,local_d8._8_4_);
      }
      uVar18 = local_c0;
      pCVar16 = local_e0;
      local_a8[0] = local_d8._0_8_;
      local_f8 = 0;
      do {
        if ((local_a8[local_f8 >> 6] >> (local_f8 & 0x3f) & 1) != 0) {
          pvVar1 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                   (&((*local_e8)->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                     )._M_impl.super__Vector_impl_data._M_start + lVar34);
          iVar8._M_current = *(unsigned_long **)(pvVar1 + 8);
          if (iVar8._M_current == *(unsigned_long **)(pvVar1 + 0x10)) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>(pvVar1,iVar8,&local_f8);
          }
          else {
            *iVar8._M_current = local_f8;
            *(unsigned_long **)(pvVar1 + 8) = iVar8._M_current + 1;
          }
        }
        local_f8 = local_f8 + 1;
      } while (local_f8 < 100);
      if ((long)(pCVar16->viewGroups).
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(pCVar16->viewGroups).
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x18) {
        this_00 = &((*local_e8)->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start + lVar34;
        local_f8 = 0;
        iVar8._M_current = this_00[1];
        if (iVar8._M_current == this_00[2]) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,iVar8,
                     &local_f8);
        }
        else {
          *iVar8._M_current = 0;
          this_00[1] = iVar8._M_current + 1;
        }
      }
      pbVar9 = (pCVar16->groupVariableOrderBitset).
               super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>._M_impl.
               super__Vector_impl_data._M_start;
      pbVar2 = pbVar9 + uVar18;
      uVar31 = (pbVar2->super__Base_bitset<2UL>)._M_w[1];
      pbVar9 = pbVar9 + uVar18;
      (pbVar9->super__Base_bitset<2UL>)._M_w[0] =
           (pbVar2->super__Base_bitset<2UL>)._M_w[0] | local_d8._0_8_;
      (pbVar9->super__Base_bitset<2UL>)._M_w[1] = uVar31 | local_d8._8_8_;
      pvVar27 = pCVar16->groupViewsPerVarInfo;
      puVar30 = (&(pCVar16->groupVariableOrder->
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Vector_impl_data._M_start)[lVar34];
      puVar10 = (&(pCVar16->groupVariableOrder->
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Vector_impl_data._M_finish)[lVar34];
      sVar21 = QueryCompiler::numberOfViews
                         ((pCVar16->_qc).
                          super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      local_f8 = 0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 (&(pvVar27->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start + lVar34),
                 (sVar21 + 2) * ((long)puVar10 - (long)puVar30 >> 3),&local_f8);
      this = local_e0;
      pvVar27 = *local_e8;
      puVar30 = (&(pvVar27->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start)[lVar34];
      if ((&(pvVar27->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish)[lVar34] != puVar30) {
        uVar18 = 0;
        do {
          if (((pTVar23->_bag).super__Base_bitset<2UL>._M_w[puVar30[uVar18] >> 6] >>
               (puVar30[uVar18] & 0x3f) & 1) != 0) {
            sVar21 = QueryCompiler::numberOfViews
                               ((this->_qc).
                                super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                               );
            puVar30 = (&(this->groupViewsPerVarInfo->
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                        super__Vector_impl_data._M_start)[lVar34];
            sVar26 = QueryCompiler::numberOfViews
                               ((this->_qc).
                                super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                               );
            lVar20 = (sVar21 + 2) * uVar18;
            (&(this->groupViewsPerVarInfo->
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start)[lVar34][lVar20 + 1] = sVar26;
            puVar30 = puVar30 + lVar20;
            *puVar30 = *puVar30 + 1;
            pvVar27 = this->groupVariableOrder;
          }
          uVar18 = uVar18 + 1;
          puVar30 = (&(pvVar27->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                      _M_impl.super__Vector_impl_data._M_start)[lVar34];
        } while (uVar18 < (ulong)((long)(&(pvVar27->
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          )._M_impl.super__Vector_impl_data._M_finish)[lVar34] -
                                  (long)puVar30 >> 3));
      }
      uVar18 = local_c0;
      uVar31 = 0;
      while (local_f8 = uVar31,
            sVar21 = QueryCompiler::numberOfViews
                               ((this->_qc).
                                super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                               ), uVar31 < sVar21) {
        uVar31 = local_f8 + 0x3f;
        if (-1 < (long)local_f8) {
          uVar31 = local_f8;
        }
        if ((local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p
             [((long)uVar31 >> 6) +
              ((ulong)((local_f8 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
             (local_f8 & 0x3f) & 1) != 0) {
          pvVar1 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                   (&((*local_b8)->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                     )._M_impl.super__Vector_impl_data._M_start + lVar34);
          iVar8._M_current = *(unsigned_long **)(pvVar1 + 8);
          if (iVar8._M_current == *(unsigned_long **)(pvVar1 + 0x10)) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>(pvVar1,iVar8,&local_f8);
          }
          else {
            *iVar8._M_current = local_f8;
            *(unsigned_long **)(pvVar1 + 8) = iVar8._M_current + 1;
          }
          pVVar22 = QueryCompiler::getView
                              ((this->_qc).
                               super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                               local_f8);
          pvVar27 = *local_e8;
          puVar30 = (&(pvVar27->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                      _M_impl.super__Vector_impl_data._M_start)[lVar34];
          if ((&(pvVar27->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                .super__Vector_impl_data._M_finish)[lVar34] != puVar30) {
            uVar31 = 0;
            do {
              if (((pVVar22->_fVars).super__Base_bitset<2UL>._M_w[puVar30[uVar31] >> 6] >>
                   (puVar30[uVar31] & 0x3f) & 1) != 0) {
                sVar21 = QueryCompiler::numberOfViews
                                   ((this->_qc).
                                    super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_ptr);
                puVar30 = (&(this->groupViewsPerVarInfo->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_start)[lVar34] +
                          (sVar21 + 2) * uVar31;
                puVar30[*puVar30 + 1] = local_f8;
                *puVar30 = *puVar30 + 1;
                pvVar27 = this->groupVariableOrder;
              }
              uVar31 = uVar31 + 1;
              puVar30 = (&(pvVar27->
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                          .super__Vector_impl_data._M_start)[lVar34];
            } while (uVar31 < (ulong)((long)(&(pvVar27->
                                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                              )._M_impl.super__Vector_impl_data._M_finish)[lVar34] -
                                      (long)puVar30 >> 3));
          }
        }
        uVar31 = local_f8 + 1;
      }
      if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 < (ulong)(((long)(this->viewGroups).
                                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->viewGroups).
                                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x5555555555555555));
  }
  sVar21 = QueryCompiler::numberOfViews
                     ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  __s = (bool *)operator_new__(sVar21);
  memset(__s,0,sVar21);
  this->_requireHashing = __s;
  sVar21 = QueryCompiler::numberOfViews
                     ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  if (sVar21 != 0) {
    sVar21 = 0;
    do {
      pVVar22 = QueryCompiler::getView
                          ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,sVar21);
      pTVar23 = TreeDecomposition::getRelation
                          ((this->_td).
                           super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           (ulong)pVVar22->_origin);
      pCVar16 = local_e0;
      p_Var11 = (_Bit_type *)(pVVar22->_fVars).super__Base_bitset<2UL>._M_w[0];
      uVar18 = (pVVar22->_fVars).super__Base_bitset<2UL>._M_w[1];
      local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p =
           (_Bit_type *)((pTVar23->_bag).super__Base_bitset<2UL>._M_w[0] & (ulong)p_Var11);
      uVar31 = (pTVar23->_bag).super__Base_bitset<2UL>._M_w[1];
      local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._8_8_ = uVar31 & uVar18;
      uVar33 = 0;
      lVar34 = 0;
      do {
        if ((*(ulong *)((long)&local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                       (uVar33 >> 6) * 8) >> (uVar33 & 0x3f) & 1) != 0) {
          if (uVar33 != this->sortOrders[pVVar22->_origin][lVar34]) {
            bVar17 = true;
            goto LAB_001f047c;
          }
          lVar34 = lVar34 + 1;
        }
        uVar33 = uVar33 + 1;
      } while (uVar33 != 100);
      bVar17 = local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p != p_Var11 ||
               (~uVar31 & 0xfffffffff & uVar18) != 0;
LAB_001f047c:
      local_e0->_requireHashing[sVar21] = bVar17;
      sVar21 = sVar21 + 1;
      sVar26 = QueryCompiler::numberOfViews
                         ((local_e0->_qc).
                          super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      this = pCVar16;
    } while (sVar21 < sVar26);
  }
  return;
}

Assistant:

void CppGenerator::createGroupVariableOrder()
{
    computeViewOrdering();
    
    groupVariableOrder = new std::vector<size_t>[viewGroups.size()]();
    groupIncomingViews = new std::vector<size_t>[viewGroups.size()]();
    groupViewsPerVarInfo = new std::vector<size_t>[viewGroups.size()];

    groupVariableOrderBitset.resize(viewGroups.size());
    
    for (size_t group = 0; group < viewGroups.size(); ++group)
    {
        var_bitset joinVars;
        std::vector<bool> incViewBitset(_qc->numberOfViews());
        
        TDNode* baseRelation = _td->getRelation(
            _qc->getView(viewGroups[group][0])->_origin);

        // TODO:TODO: is it ok to add this in ?!??
        // we are adding the variables in the intersection with the destination
        TDNode* destRelation = _td->getRelation(
            _qc->getView(viewGroups[group][0])->_destination);

        if (baseRelation->_id != destRelation->_id)
            joinVars |= destRelation->_bag & baseRelation->_bag;

        for (const size_t& viewID : viewGroups[group])
        {
            View* view = _qc->getView(viewID);

            TDNode* destRelation = _td->getRelation(view->_destination);

            size_t numberIncomingViews =
                (view->_origin == view->_destination ? baseRelation->_numOfNeighbors :
                 baseRelation->_numOfNeighbors - 1);

            // if ther are not inc views we use the fVars as free variable
            if (numberIncomingViews == 0)
                joinVars |= (view->_fVars & destRelation->_bag);
            else
            {
                for (size_t aggNo = 0; aggNo < view->_aggregates.size(); ++aggNo)
                {
                    Aggregate* aggregate = view->_aggregates[aggNo];

                    size_t incOffset = 0;
                    // First find the all views that contribute to this Aggregate
                    for (size_t i = 0; i < aggregate->_agg.size(); ++i)
                    {
                        for (size_t j = 0; j < numberIncomingViews; j++)
                        {
                            const size_t& incViewID =
                                aggregate->_incoming[incOffset].first;


                            // TODO: TODO: TODO: MAKE SURE THAT YOU ALSO
                            // CONSIDER INTERSECTION OF FREE VARS THAT ARE
                            // SHARED B/W TWO VIEWS BUT NOT IN BAG
                            
                            // Add the intersection of the view and the base
                            // relation to joinVars
                            joinVars |= (_qc->getView(incViewID)->_fVars &
                                         baseRelation->_bag);
                            // Indicate that this view contributes to some aggregate
                            incViewBitset[incViewID] = 1;
                            ++incOffset;
                        }                        
                    }
                }
            }
        }

        for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
            if (joinVars[var])
                groupVariableOrder[group].push_back(var);

        if(viewGroups.size() == 1) {
            DINFO("There is only a single relation! \n"); 
            assert(groupVariableOrder[group].size() == 0);
            assert(destRelation->_bag[0]);
            groupVariableOrder[group].push_back(0);
        }


        groupVariableOrderBitset[group] |= joinVars;
        
        groupViewsPerVarInfo[group].resize(groupVariableOrder[group].size() *
                                       (_qc->numberOfViews() + 2), 0);

        // For each variable, check if the baseRelation contains this variable
        for (size_t var=0; var < groupVariableOrder[group].size(); ++var)
        {
            if (baseRelation->_bag[groupVariableOrder[group][var]])
            {
                size_t idx = var * (_qc->numberOfViews() + 2);
                size_t& off = groupViewsPerVarInfo[group][idx];
                groupViewsPerVarInfo[group][idx+1] = _qc->numberOfViews();
                ++off;
            }
        }

        // For each incoming view, check if it contains any vars from the
        // variable order and then add it to the corresponding info
        for (size_t incViewID=0; incViewID < _qc->numberOfViews(); ++incViewID)
        {
            if (incViewBitset[incViewID])
            {
                groupIncomingViews[group].push_back(incViewID);
                const var_bitset& viewFVars = _qc->getView(incViewID)->_fVars;
                    
                for (size_t var=0; var < groupVariableOrder[group].size(); ++var)
                {
                    if (viewFVars[groupVariableOrder[group][var]])
                    {
                        size_t idx = var * (_qc->numberOfViews() + 2);
                        size_t& off = groupViewsPerVarInfo[group][idx];
                        groupViewsPerVarInfo[group][idx+off+1] = incViewID;
                        ++off;
                    }
                }
            }
        }      
    }

    _requireHashing = new bool[_qc->numberOfViews()]();

    for (size_t viewID = 0; viewID < _qc->numberOfViews(); ++viewID)
    {
        View* view = _qc->getView(viewID);
        bool hash = false;
        size_t orderIdx = 0;
        
        var_bitset intersection = view->_fVars & _td->getRelation(view->_origin)->_bag;
        
        for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
        {
            if (intersection[var])
            {
                if (sortOrders[view->_origin][orderIdx] != var)
                {
                    hash = true;
                    break;
                }
                ++orderIdx;
            }
        }
        _requireHashing[viewID] = hash || (view->_fVars & ~intersection).any();
    }
}